

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  XML_Convert_Result XVar3;
  char **ppcVar4;
  long lVar5;
  unsigned_short **ppuVar6;
  uint uVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  int iVar9;
  int iVar10;
  unsigned_short *in_R8;
  
  ppcVar4 = (char **)(end + -(long)ptr);
  if ((long)ppcVar4 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar9 = 0;
  uVar7 = bVar1 - 5;
  if (uVar7 < 0x14) {
    pcVar8 = (char *)((long)&switchD_0017dd1a::switchdataD_001acb1c +
                     (long)(int)(&switchD_0017dd1a::switchdataD_001acb1c)[uVar7]);
    iVar10 = 0;
    switch((uint)bVar1) {
    case 5:
      if (ppcVar4 == (char **)0x1) {
        return -2;
      }
      iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,ppcVar4);
      iVar10 = iVar9;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar4);
        while( true ) {
          lVar5 = 2;
          while( true ) {
            iVar10 = iVar9;
            if (XVar3 == XML_CONVERT_COMPLETED) goto switchD_0017dd1a_caseD_8;
LAB_0017dddc:
            while( true ) {
              ptr = (char *)((long)ptr + lVar5);
              lVar5 = (long)end - (long)ptr;
              if (lVar5 < 1) {
                return -1;
              }
              ppuVar6 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar6);
              pcVar8 = (char *)(ulong)bVar1;
              if (bVar1 < 0x12) break;
              lVar5 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar10 = iVar9;
                if (bVar1 == 0x12) {
                  ptr = (char *)((long)ptr + 1);
                  iVar10 = 0x1c;
                }
                goto switchD_0017dd1a_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (lVar5 < 3) {
                return -2;
              }
              iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar8,(char **)ppuVar6);
              iVar10 = iVar9;
              if (iVar2 != 0) goto switchD_0017dd1a_caseD_8;
              XVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_0017deac:
              lVar5 = 3;
            }
            else {
              iVar10 = iVar9;
              if (bVar1 != 7) goto switchD_0017dd1a_caseD_8;
              if (lVar5 < 4) {
                return -2;
              }
              iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar8,(char *)ppuVar6);
              if (iVar2 != 0) goto switchD_0017dd1a_caseD_8;
              XVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,(char **)ppuVar6);
LAB_0017de6d:
              lVar5 = 4;
            }
          }
          if (lVar5 == 1) {
            return -2;
          }
          iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,(char **)ppuVar6);
          iVar10 = iVar9;
          if (iVar2 != 0) break;
          XVar3 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_03,ppuVar6,in_R8);
        }
      }
      break;
    case 6:
      if ((long)ppcVar4 < 3) {
        return -2;
      }
      iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar8,ppcVar4);
      iVar10 = iVar9;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX,ppcVar4);
        goto LAB_0017deac;
      }
      break;
    case 7:
      if ((long)ppcVar4 < 4) {
        return -2;
      }
      iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar8,(char *)ppcVar4);
      iVar10 = iVar9;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_01,ppcVar4);
        goto LAB_0017de6d;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0017dd1a_caseD_9;
    case 0x16:
    case 0x18:
      lVar5 = 1;
      goto LAB_0017dddc;
    }
  }
  else {
    iVar10 = iVar9;
    if (bVar1 != 0x1e) goto switchD_0017dd1a_caseD_8;
switchD_0017dd1a_caseD_9:
    iVar10 = 0x16;
  }
switchD_0017dd1a_caseD_8:
  *nextTokPtr = ptr;
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}